

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

GraphRuntime *
tvm::runtime::SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::New<>
          (SimpleObjAllocator *param_1)

{
  GraphRuntime *this;
  StorageType *data;
  SimpleObjAllocator *param_0_local;
  
  this = (GraphRuntime *)operator_new(0x200);
  memset(this,0,0x200);
  memset(this,0,0x200);
  GraphRuntime::GraphRuntime(this);
  return this;
}

Assistant:

static T* New(SimpleObjAllocator*, Args&&... args) {
      // NOTE: the first argument is not needed for SimpleObjAllocator
      // It is reserved for special allocators that needs to recycle
      // the object to itself (e.g. in the case of object pool).
      //
      // In the case of an object pool, an allocator needs to create
      // a special chunk memory that hides reference to the allocator
      // and call allocator's release function in the deleter.

      // NOTE2: Use inplace new to allocate
      // This is used to get rid of warning when deleting a virtual
      // class with non-virtual destructor.
      // We are fine here as we captured the right deleter during construction.
      // This is also the right way to get storage type for an object pool.
      StorageType* data = new StorageType();
      new (data) T(std::forward<Args>(args)...);
      return reinterpret_cast<T*>(data);
    }